

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int serialGet7(uchar *buf,Mem *pMem)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  u16 uVar6;
  uint uVar7;
  bool bVar8;
  
  bVar1 = buf[1];
  uVar3 = (uint)bVar1 << 0x10 | (uint)*buf << 0x18;
  uVar4 = (uint)(ushort)(*(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8);
  uVar7 = (uint)buf[5] << 0x10 | (uint)buf[4] << 0x18;
  uVar5 = (ulong)(ushort)(*(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8);
  (pMem->u).i = uVar5 | CONCAT44(uVar4 | uVar3,uVar7);
  bVar8 = (~uVar3 & 0x7ff00000) == 0;
  bVar2 = ((uint)bVar1 << 0x10 & 0xfffff) != 0;
  uVar6 = 8;
  if ((uVar5 != 0 || (uVar7 != 0 || (uVar4 != 0 || bVar2))) && bVar8) {
    uVar6 = 1;
  }
  pMem->flags = uVar6;
  return (int)((uVar5 != 0 || (uVar7 != 0 || (uVar4 != 0 || bVar2))) && bVar8);
}

Assistant:

static int serialGet7(
  const unsigned char *buf,     /* Buffer to deserialize from */
  Mem *pMem                     /* Memory cell to write value into */
){
  u64 x = FOUR_BYTE_UINT(buf);
  u32 y = FOUR_BYTE_UINT(buf+4);
  x = (x<<32) + y;
  assert( sizeof(x)==8 && sizeof(pMem->u.r)==8 );
  swapMixedEndianFloat(x);
  memcpy(&pMem->u.r, &x, sizeof(x));
  if( IsNaN(x) ){
    pMem->flags = MEM_Null;
    return 1;
  }
  pMem->flags = MEM_Real;
  return 0;
}